

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O3

RGBColorSpace * pbrt::RGBColorSpace::Lookup(Point2f r,Point2f g,Point2f b,Point2f w)

{
  float fVar1;
  RGBColorSpace *pRVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  float fVar9;
  undefined8 in_XMM0_Qb;
  float fVar10;
  undefined8 in_XMM1_Qb;
  float fVar11;
  undefined8 in_XMM2_Qb;
  float fVar12;
  undefined8 in_XMM3_Qb;
  float fVar13;
  undefined1 auVar14 [16];
  long local_20 [4];
  
  fVar12 = w.super_Tuple2<pbrt::Point2,_float>.x;
  fVar11 = b.super_Tuple2<pbrt::Point2,_float>.x;
  fVar10 = g.super_Tuple2<pbrt::Point2,_float>.x;
  fVar9 = r.super_Tuple2<pbrt::Point2,_float>.x;
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar4._8_8_ = in_XMM3_Qb;
  auVar4._0_8_ = w.super_Tuple2<pbrt::Point2,_float>;
  auVar4 = vmovshdup_avx(auVar4);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = r.super_Tuple2<pbrt::Point2,_float>;
  auVar5 = vmovshdup_avx(auVar5);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = g.super_Tuple2<pbrt::Point2,_float>;
  auVar6 = vmovshdup_avx(auVar6);
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = b.super_Tuple2<pbrt::Point2,_float>;
  auVar7 = vmovshdup_avx(auVar7);
  lVar8 = 0;
  local_20[0] = ACES2065_1;
  local_20[1] = DCI_P3;
  local_20[2] = Rec2020;
  local_20[3] = sRGB;
  do {
    pRVar2 = *(RGBColorSpace **)((long)local_20 + lVar8);
    fVar13 = (pRVar2->r).super_Tuple2<pbrt::Point2,_float>.x;
    fVar1 = (pRVar2->r).super_Tuple2<pbrt::Point2,_float>.y;
    if (((fVar9 == fVar13) && (!NAN(fVar9) && !NAN(fVar13))) ||
       (auVar3 = vandps_avx(ZEXT416((uint)((fVar9 - fVar13) / fVar13)),auVar14),
       auVar3._0_4_ < 0.001)) {
      fVar13 = auVar5._0_4_;
      if (((fVar13 == fVar1) && (!NAN(fVar13) && !NAN(fVar1))) ||
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar13 - fVar1) / fVar1)),auVar14),
         auVar3._0_4_ < 0.001)) {
        fVar13 = (pRVar2->g).super_Tuple2<pbrt::Point2,_float>.x;
        fVar1 = (pRVar2->g).super_Tuple2<pbrt::Point2,_float>.y;
        if (((fVar10 == fVar13) && (!NAN(fVar10) && !NAN(fVar13))) ||
           (auVar3 = vandps_avx(ZEXT416((uint)((fVar10 - fVar13) / fVar13)),auVar14),
           auVar3._0_4_ < 0.001)) {
          fVar13 = auVar6._0_4_;
          if (((fVar13 == fVar1) && (!NAN(fVar13) && !NAN(fVar1))) ||
             (auVar3 = vandps_avx(ZEXT416((uint)((fVar13 - fVar1) / fVar1)),auVar14),
             auVar3._0_4_ < 0.001)) {
            fVar13 = (pRVar2->b).super_Tuple2<pbrt::Point2,_float>.x;
            fVar1 = (pRVar2->b).super_Tuple2<pbrt::Point2,_float>.y;
            if (((fVar11 == fVar13) && (!NAN(fVar11) && !NAN(fVar13))) ||
               (auVar3 = vandps_avx(ZEXT416((uint)((fVar11 - fVar13) / fVar13)),auVar14),
               auVar3._0_4_ < 0.001)) {
              fVar13 = auVar7._0_4_;
              if (((fVar13 == fVar1) && (!NAN(fVar13) && !NAN(fVar1))) ||
                 (auVar3 = vandps_avx(ZEXT416((uint)((fVar13 - fVar1) / fVar1)),auVar14),
                 auVar3._0_4_ < 0.001)) {
                fVar13 = (pRVar2->w).super_Tuple2<pbrt::Point2,_float>.x;
                fVar1 = (pRVar2->w).super_Tuple2<pbrt::Point2,_float>.y;
                if (((fVar12 == fVar13) && (!NAN(fVar12) && !NAN(fVar13))) ||
                   (auVar3 = vandps_avx(ZEXT416((uint)((fVar12 - fVar13) / fVar13)),auVar14),
                   auVar3._0_4_ < 0.001)) {
                  fVar13 = auVar4._0_4_;
                  if ((fVar13 == fVar1) && (!NAN(fVar13) && !NAN(fVar1))) {
                    return pRVar2;
                  }
                  auVar3 = vandps_avx(ZEXT416((uint)((fVar13 - fVar1) / fVar1)),auVar14);
                  if (auVar3._0_4_ < 0.001) {
                    return pRVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
    lVar8 = lVar8 + 8;
    if (lVar8 == 0x20) {
      return (RGBColorSpace *)0x0;
    }
  } while( true );
}

Assistant:

const RGBColorSpace *RGBColorSpace::Lookup(Point2f r, Point2f g, Point2f b, Point2f w) {
    auto closeEnough = [](const Point2f &a, const Point2f &b) {
        return ((a.x == b.x || std::abs((a.x - b.x) / b.x) < 1e-3) &&
                (a.y == b.y || std::abs((a.y - b.y) / b.y) < 1e-3));
    };
    for (const RGBColorSpace *cs : {ACES2065_1, DCI_P3, Rec2020, sRGB}) {
        if (closeEnough(r, cs->r) && closeEnough(g, cs->g) && closeEnough(b, cs->b) &&
            closeEnough(w, cs->w))
            return cs;
    }
    return nullptr;
}